

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lefreader.cpp
# Opt level: O0

bool __thiscall LEFReader::parseForeign(LEFReader *this)

{
  token_t tVar1;
  allocator<char> local_161;
  string local_160 [2];
  invalid_argument *ia;
  double ynumd;
  double xnumd;
  string local_f8;
  allocator<char> local_d1;
  string local_d0;
  undefined4 local_b0;
  allocator<char> local_a9;
  string local_a8;
  undefined1 local_78 [8];
  string ynum;
  string xnum;
  string cellname;
  LEFReader *this_local;
  
  std::__cxx11::string::string((string *)(xnum.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(ynum.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_78);
  tVar1 = tokenize(this,(string *)(xnum.field_2._M_local_buf + 8));
  this->m_curtok = tVar1;
  if (this->m_curtok == TOK_IDENT) {
    tVar1 = tokenize(this,(string *)((long)&ynum.field_2 + 8));
    this->m_curtok = tVar1;
    if (this->m_curtok == TOK_NUMBER) {
      tVar1 = tokenize(this,(string *)local_78);
      this->m_curtok = tVar1;
      if (this->m_curtok == TOK_NUMBER) {
        tVar1 = tokenize(this,&this->m_tokstr);
        this->m_curtok = tVar1;
        if (this->m_curtok == TOK_SEMICOL) {
          ynumd = std::__cxx11::stod((string *)((long)&ynum.field_2 + 8),(size_t *)0x0);
          ia = (invalid_argument *)std::__cxx11::stod((string *)local_78,(size_t *)0x0);
          (*this->_vptr_LEFReader[5])(ynumd,ia,this,(undefined1 *)((long)&xnum.field_2 + 8));
          this_local._7_1_ = true;
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_f8,"Expected a semicolon\n",
                     (allocator<char> *)((long)&xnumd + 7));
          error(this,&local_f8);
          std::__cxx11::string::~string((string *)&local_f8);
          std::allocator<char>::~allocator((allocator<char> *)((long)&xnumd + 7));
          this_local._7_1_ = false;
        }
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_d0,"Expected a number\n",&local_d1);
        error(this,&local_d0);
        std::__cxx11::string::~string((string *)&local_d0);
        std::allocator<char>::~allocator(&local_d1);
        this_local._7_1_ = false;
      }
    }
    else if (this->m_curtok == TOK_SEMICOL) {
      (*this->_vptr_LEFReader[5])(0,this,(undefined1 *)((long)&xnum.field_2 + 8));
      this_local._7_1_ = true;
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_160,"Expected a number or semicolon\n",&local_161);
      error(this,local_160);
      std::__cxx11::string::~string((string *)local_160);
      std::allocator<char>::~allocator(&local_161);
      this_local._7_1_ = false;
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a8,"Expected the cell name\n",&local_a9);
    error(this,&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
    std::allocator<char>::~allocator(&local_a9);
    this_local._7_1_ = false;
  }
  local_b0 = 1;
  std::__cxx11::string::~string((string *)local_78);
  std::__cxx11::string::~string((string *)(ynum.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(xnum.field_2._M_local_buf + 8));
  return this_local._7_1_;
}

Assistant:

bool LEFReader::parseForeign()
{
    // FOREIGN <cellname> [<number> <number>] ; 

    std::string cellname;
    std::string xnum;
    std::string ynum;

    m_curtok = tokenize(cellname);
    if (m_curtok != TOK_IDENT)
    {
        error("Expected the cell name\n");
        return false;
    }

    // foreign point is optional

    m_curtok = tokenize(xnum);
    if (m_curtok == TOK_NUMBER)
    {
        m_curtok = tokenize(ynum);
        if (m_curtok != TOK_NUMBER)
        {
            error("Expected a number\n");
            return false;
        }

        m_curtok = tokenize(m_tokstr);
        if (m_curtok != TOK_SEMICOL)
        {
            error("Expected a semicolon\n");
            return false;
        }

        double xnumd, ynumd;
        try
        {
            xnumd = std::stod(xnum);
            ynumd = std::stod(ynum);
        }
        catch(const std::invalid_argument& ia)
        {
            error(ia.what());
        }

        onForeign(cellname, xnumd, ynumd);
        return true;
    }
    else if (m_curtok != TOK_SEMICOL)
    {
        error("Expected a number or semicolon\n");
        return false;
    }    

    onForeign(cellname, 0, 0);

    return true;
}